

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O2

void __thiscall Qclass::createGrid(Qclass *this)

{
  int *piVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  long local_210;
  ofstream outfile;
  uint auStack_1f8 [122];
  
  piVar1 = this->grid[0x1e] + 0x28;
  for (lVar3 = 0x1e; lVar3 != 0x2e; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      piVar1[lVar4] = 1;
    }
    piVar1 = piVar1 + 0x32;
  }
  piVar1 = this->grid[10] + 10;
  for (lVar3 = 10; lVar3 != 0x15; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x15; lVar4 = lVar4 + 1) {
      piVar1[lVar4] = 1;
    }
    piVar1 = piVar1 + 0x32;
  }
  std::ofstream::ofstream(&local_210);
  std::ofstream::open((char *)&local_210,0x140170);
  *(undefined8 *)(&outfile + *(long *)(local_210 + -0x18)) = 6;
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,0x1e);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,0x28);
  std::endl<char,std::char_traits<char>>((ostream *)&local_210);
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,0x1e);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,0x2d);
  std::endl<char,std::char_traits<char>>((ostream *)&local_210);
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,0x2d);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,0x2d);
  std::endl<char,std::char_traits<char>>((ostream *)&local_210);
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,0x2d);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,0x28);
  std::endl<char,std::char_traits<char>>((ostream *)&local_210);
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,0x1e);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,0x28);
  std::ofstream::close();
  std::ofstream::open((char *)&local_210,0x1405b9);
  *(undefined8 *)(&outfile + *(long *)(local_210 + -0x18)) = 6;
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,10);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,10);
  std::endl<char,std::char_traits<char>>((ostream *)&local_210);
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,10);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,0x1e);
  std::endl<char,std::char_traits<char>>((ostream *)&local_210);
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,0x14);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,0x1e);
  std::endl<char,std::char_traits<char>>((ostream *)&local_210);
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,0x14);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,10);
  std::endl<char,std::char_traits<char>>((ostream *)&local_210);
  *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) =
       *(uint *)((long)auStack_1f8 + *(long *)(local_210 + -0x18)) & 0xfffffefb | 4;
  poVar2 = (ostream *)std::ostream::operator<<(&local_210,10);
  poVar2 = std::operator<<(poVar2,"   ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar2,10);
  std::ofstream::close();
  std::ofstream::~ofstream(&local_210);
  return;
}

Assistant:

void Qclass::createGrid() {
  for (int i = 30; i < 46; i++) {
    for (int j = 40; j < 46; j++) {
      grid[i][j] = 1;
    }
  }
  for (int i = 10; i < 21; i++) {
    for (int j = 10; j < 31; j++) {
      grid[i][j] = 1;
    }
  }
  std::ofstream outfile;
  outfile.open("Obstacles1.txt", std::ios::out | std::ios::trunc);
  outfile.precision(6);
  outfile << std::fixed << 30 << "   " << std::fixed << 40;
  outfile << std::endl;
  outfile << std::fixed << 30 << "   " << std::fixed << 45;
  outfile << std::endl;
  outfile << std::fixed << 45 << "   " << std::fixed << 45;
  outfile << std::endl;
  outfile << std::fixed << 45 << "   " << std::fixed << 40;
  outfile << std::endl;
  outfile << std::fixed << 30 << "   " << std::fixed << 40;
  outfile.close();
  outfile.open("Obstacles2.txt", std::ios::out | std::ios::trunc);
  outfile.precision(6);
  outfile << std::fixed << 10 << "   " << std::fixed << 10;
  outfile << std::endl;
  outfile << std::fixed << 10 << "   " << std::fixed << 30;
  outfile << std::endl;
  outfile << std::fixed << 20 << "   " << std::fixed << 30;
  outfile << std::endl;
  outfile << std::fixed << 20 << "   " << std::fixed << 10;
  outfile << std::endl;
  outfile << std::fixed << 10 << "   " << std::fixed << 10;
  outfile.close();
}